

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::MultiDrawIndexed
          (DeviceContextVkImpl *this,MultiDrawIndexedAttribs *Attribs)

{
  Uint32 *pUVar1;
  int iVar2;
  undefined4 uVar3;
  VkMultiDrawIndexedInfoEXT *pIndexInfo;
  MultiDrawIndexedItem *pMVar4;
  ulong uVar5;
  uint32_t uVar6;
  long lVar7;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::MultiDrawIndexed
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs,0);
  PrepareForIndexedDraw(this,Attribs->Flags,Attribs->IndexType);
  if (Attribs->NumInstances != 0) {
    if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NativeMultiDrawSupported == false) {
      if (Attribs->DrawCount != 0) {
        lVar7 = 8;
        uVar5 = 0;
        do {
          pMVar4 = Attribs->pDrawItems;
          uVar6 = *(uint32_t *)((long)pMVar4 + lVar7 + -8);
          if (uVar6 != 0) {
            VulkanUtilities::VulkanCommandBuffer::DrawIndexed
                      (&this->m_CommandBuffer,uVar6,Attribs->NumInstances,
                       *(uint32_t *)((long)pMVar4 + lVar7 + -4),
                       *(int32_t *)((long)&pMVar4->NumIndices + lVar7),
                       Attribs->FirstInstanceLocation);
            pUVar1 = &(this->m_State).NumCommands;
            *pUVar1 = *pUVar1 + 1;
          }
          uVar5 = uVar5 + 1;
          lVar7 = lVar7 + 0xc;
        } while (uVar5 < Attribs->DrawCount);
      }
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                  super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_ScratchSpace,
                 (ulong)Attribs->DrawCount * 0xc);
      pIndexInfo = (VkMultiDrawIndexedInfoEXT *)
                   (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                   super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_ScratchSpace.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
      if (Attribs->DrawCount == 0) {
        uVar6 = 0;
      }
      else {
        pMVar4 = Attribs->pDrawItems;
        uVar5 = 0;
        lVar7 = 8;
        uVar6 = 0;
        do {
          iVar2 = *(int *)((long)pMVar4 + lVar7 + -8);
          if (iVar2 != 0) {
            uVar3 = *(undefined4 *)((long)&pMVar4->NumIndices + lVar7);
            *(undefined4 *)((long)pIndexInfo + lVar7 + -8) =
                 *(undefined4 *)((long)pMVar4 + lVar7 + -4);
            *(int *)((long)pIndexInfo + lVar7 + -4) = iVar2;
            *(undefined4 *)((long)&pIndexInfo->firstIndex + lVar7) = uVar3;
            uVar6 = uVar6 + 1;
          }
          uVar5 = uVar5 + 1;
          lVar7 = lVar7 + 0xc;
        } while (uVar5 < Attribs->DrawCount);
      }
      if (uVar6 != 0) {
        VulkanUtilities::VulkanCommandBuffer::MultiDrawIndexed
                  (&this->m_CommandBuffer,uVar6,pIndexInfo,Attribs->NumInstances,
                   Attribs->FirstInstanceLocation);
        return;
      }
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::MultiDrawIndexed(const MultiDrawIndexedAttribs& Attribs)
{
    TDeviceContextBase::MultiDrawIndexed(Attribs, 0);

    PrepareForIndexedDraw(Attribs.Flags, Attribs.IndexType);

    if (Attribs.NumInstances == 0)
        return;

    if (m_NativeMultiDrawSupported)
    {
        m_ScratchSpace.resize(sizeof(VkMultiDrawIndexedInfoEXT) * Attribs.DrawCount);
        VkMultiDrawIndexedInfoEXT* pDrawInfo = reinterpret_cast<VkMultiDrawIndexedInfoEXT*>(m_ScratchSpace.data());

        Uint32 DrawCount = 0;
        for (Uint32 i = 0; i < Attribs.DrawCount; ++i)
        {
            const MultiDrawIndexedItem& Item = Attribs.pDrawItems[i];
            if (Item.NumIndices > 0)
            {
                pDrawInfo[i] = {Item.FirstIndexLocation, Item.NumIndices, static_cast<int32_t>(Item.BaseVertex)};
                ++DrawCount;
            }
        }
        if (DrawCount > 0)
        {
            m_CommandBuffer.MultiDrawIndexed(DrawCount, pDrawInfo, Attribs.NumInstances, Attribs.FirstInstanceLocation);
        }
    }
    else
    {
        for (Uint32 i = 0; i < Attribs.DrawCount; ++i)
        {
            const MultiDrawIndexedItem& Item = Attribs.pDrawItems[i];
            if (Item.NumIndices > 0)
            {
                m_CommandBuffer.DrawIndexed(Item.NumIndices, Attribs.NumInstances, Item.FirstIndexLocation, Item.BaseVertex, Attribs.FirstInstanceLocation);
                ++m_State.NumCommands;
            }
        }
    }
}